

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RewardModelMapping.cpp
# Opt level: O1

string * __thiscall
RewardModelMapping::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,RewardModelMapping *this)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(this->_m_s_str)._M_dataplus._M_p,(this->_m_s_str)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->_m_ja_str)._M_dataplus._M_p,(this->_m_ja_str)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"R(",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->_m_s_str)._M_dataplus._M_p,(this->_m_s_str)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->_m_ja_str)._M_dataplus._M_p,(this->_m_ja_str)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") (rewards of 0 are not printed)",0x20)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  dVar4 = (double)std::ostream::flush();
  if ((this->super_RewardModel)._m_nrStates != 0) {
    uVar3 = 0;
    do {
      if ((this->super_RewardModel)._m_nrJointActions != 0) {
        uVar2 = 0;
        do {
          (**(this->super_RewardModel).super_RewardModelDiscreteInterface.super_QTableInterface.
             _vptr_QTableInterface)(this,uVar3,uVar2);
          if (dVar4 != 0.0) {
            poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
            poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
            poVar1 = std::ostream::_M_insert<double>(dVar4);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
            std::ostream::put((char)poVar1);
            dVar4 = (double)std::ostream::flush();
          }
          uVar2 = (ulong)((int)uVar2 + 1);
        } while (uVar2 < (this->super_RewardModel)._m_nrJointActions);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (this->super_RewardModel)._m_nrStates);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string RewardModelMapping::SoftPrint() const
{
    stringstream ss;
    double r;
    ss << _m_s_str <<"\t"<< _m_ja_str <<"\t"
       << "R(" << _m_s_str <<","<< _m_ja_str
       <<  ") (rewards of 0 are not printed)"<<endl;
    for(Index s_i = 0; s_i < GetNrStates(); s_i++)
        for(Index ja_i = 0; ja_i < GetNrJointActions(); ja_i++)
        {
            r=Get(s_i, ja_i);
            if(std::abs(r)>0)
                ss << s_i << "\t" << ja_i << "\t" << r << endl;
        }
    return(ss.str());
}